

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

ENetPeer * enet_host_connect(ENetHost *host,ENetAddress *address,size_t channelCount,uint32_t data)

{
  uint8_t uVar1;
  uint8_t uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ENetPeer *pEVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  in_addr_t iVar14;
  ENetPeer *pEVar15;
  undefined2 uVar16;
  uint32_t uVar17;
  size_t sVar18;
  ENetChannel *pEVar19;
  ENetPeer *pEVar20;
  ENetOutgoingCommand *outgoingCommand;
  ENetPeer *pEVar21;
  size_t sVar22;
  bool bVar23;
  
  sVar18 = 0xff;
  if (channelCount < 0xff) {
    sVar18 = channelCount;
  }
  sVar22 = 1;
  if (channelCount != 0) {
    sVar22 = sVar18;
  }
  sVar18 = host->peerCount;
  bVar23 = 0 < (long)sVar18;
  if ((long)sVar18 < 1) {
    return (ENetPeer *)0x0;
  }
  pEVar20 = host->peers;
  if (pEVar20->state != ENET_PEER_STATE_DISCONNECTED) {
    pEVar21 = pEVar20 + sVar18;
    pEVar11 = pEVar20;
    do {
      pEVar20 = pEVar11 + 1;
      bVar23 = pEVar20 < pEVar21;
      if (!bVar23) {
        return (ENetPeer *)0x0;
      }
      pEVar15 = pEVar11 + 1;
      pEVar11 = pEVar20;
    } while (pEVar15->state != ENET_PEER_STATE_DISCONNECTED);
  }
  if (!bVar23) {
    return (ENetPeer *)0x0;
  }
  pEVar19 = (ENetChannel *)(*(code *)callbacks_0)(sVar22 * 0x50);
  if (pEVar19 == (ENetChannel *)0x0) {
    pEVar20 = (ENetPeer *)(*(code *)callbacks_2)();
    return pEVar20;
  }
  pEVar20->channels = pEVar19;
  if (pEVar19 == (ENetChannel *)0x0) {
    return (ENetPeer *)0x0;
  }
  pEVar20->channelCount = sVar22;
  pEVar20->state = ENET_PEER_STATE_CONNECTING;
  uVar12 = *(undefined4 *)((long)&address->field_0 + 4);
  uVar13 = *(undefined4 *)((long)&address->field_0 + 8);
  iVar14 = (address->field_0).ipv4.ip.s_addr;
  *(undefined4 *)&(pEVar20->address).field_0 = *(undefined4 *)&address->field_0;
  *(undefined4 *)((long)&(pEVar20->address).field_0 + 4) = uVar12;
  *(undefined4 *)((long)&(pEVar20->address).field_0 + 8) = uVar13;
  (pEVar20->address).field_0.ipv4.ip.s_addr = iVar14;
  uVar16 = *(undefined2 *)&address->field_0x12;
  (pEVar20->address).port = address->port;
  *(undefined2 *)&(pEVar20->address).field_0x12 = uVar16;
  uVar17 = host->randomSeed + 1;
  host->randomSeed = uVar17;
  pEVar20->connectID = uVar17;
  uVar17 = 0x10000;
  uVar4 = host->outgoingBandwidth >> 4 & 0xffff000;
  if (host->outgoingBandwidth == 0) {
    uVar4 = 0x10000;
  }
  pEVar20->windowSize = uVar4;
  if (uVar4 == 0) {
    uVar17 = 0x1000;
  }
  else if (uVar4 < 0x10001) goto LAB_00107351;
  pEVar20->windowSize = uVar17;
LAB_00107351:
  if (sVar22 != 0) {
    pEVar19 = pEVar20->channels;
    do {
      pEVar19->outgoingReliableSequenceNumber = 0;
      pEVar19->outgoingUnreliableSequenceNumber = 0;
      pEVar19->incomingUnreliableSequenceNumber = 0;
      (pEVar19->incomingReliableCommands).sentinel.next =
           &(pEVar19->incomingReliableCommands).sentinel;
      (pEVar19->incomingReliableCommands).sentinel.previous =
           &(pEVar19->incomingReliableCommands).sentinel;
      (pEVar19->incomingUnreliableCommands).sentinel.next =
           &(pEVar19->incomingUnreliableCommands).sentinel;
      (pEVar19->incomingUnreliableCommands).sentinel.previous =
           &(pEVar19->incomingUnreliableCommands).sentinel;
      pEVar19->usedReliableWindows = 0;
      pEVar19->reliableWindows[0] = 0;
      pEVar19->reliableWindows[1] = 0;
      pEVar19->reliableWindows[2] = 0;
      pEVar19->reliableWindows[3] = 0;
      pEVar19->reliableWindows[4] = 0;
      pEVar19->reliableWindows[5] = 0;
      pEVar19->reliableWindows[6] = 0;
      pEVar19->reliableWindows[7] = 0;
      pEVar19->reliableWindows[8] = 0;
      pEVar19->reliableWindows[9] = 0;
      pEVar19->reliableWindows[10] = 0;
      pEVar19->reliableWindows[0xb] = 0;
      pEVar19->reliableWindows[0xc] = 0;
      pEVar19->reliableWindows[0xd] = 0;
      pEVar19->reliableWindows[0xe] = 0;
      *(undefined4 *)(pEVar19->reliableWindows + 0xf) = 0;
      pEVar19 = pEVar19 + 1;
    } while (pEVar19 < pEVar20->channels + sVar22);
  }
  uVar3 = pEVar20->incomingPeerID;
  uVar1 = pEVar20->incomingSessionID;
  uVar2 = pEVar20->outgoingSessionID;
  uVar4 = pEVar20->mtu;
  uVar5 = pEVar20->windowSize;
  uVar6 = host->incomingBandwidth;
  uVar7 = host->outgoingBandwidth;
  uVar8 = pEVar20->packetThrottleInterval;
  uVar9 = pEVar20->packetThrottleAcceleration;
  uVar10 = pEVar20->packetThrottleDeceleration;
  uVar17 = pEVar20->connectID;
  outgoingCommand = (ENetOutgoingCommand *)(*(code *)callbacks_0)(0x60);
  if (outgoingCommand == (ENetOutgoingCommand *)0x0) {
    pEVar20 = (ENetPeer *)(*(code *)callbacks_2)();
    return pEVar20;
  }
  *(undefined2 *)&outgoingCommand->command = 0xff82;
  (outgoingCommand->command).acknowledge.receivedReliableSequenceNumber = uVar3 << 8 | uVar3 >> 8;
  (outgoingCommand->command).connect.incomingSessionID = uVar1;
  (outgoingCommand->command).connect.outgoingSessionID = uVar2;
  (outgoingCommand->command).connect.mtu =
       uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  (outgoingCommand->command).connect.windowSize =
       uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  (outgoingCommand->command).connect.channelCount = (int)sVar22 << 0x18;
  (outgoingCommand->command).connect.incomingBandwidth =
       uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  (outgoingCommand->command).connect.outgoingBandwidth =
       uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  (outgoingCommand->command).connect.packetThrottleInterval =
       uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
  (outgoingCommand->command).connect.packetThrottleAcceleration =
       uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  (outgoingCommand->command).connect.packetThrottleDeceleration =
       uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  (outgoingCommand->command).connect.connectID = uVar17;
  (outgoingCommand->command).connect.data =
       data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
  outgoingCommand->fragmentOffset = 0;
  outgoingCommand->fragmentLength = 0;
  outgoingCommand->packet = (ENetPacket *)0x0;
  enet_peer_setup_outgoing_command(pEVar20,outgoingCommand);
  return pEVar20;
}

Assistant:

ENetPeer* enet_host_connect(ENetHost* host, const ENetAddress* address, size_t channelCount, uint32_t data) {
	ENET_LOG_TRACE("A ENet Host is trying to establish a connection.");

	ENetPeer* currentPeer;
	ENetChannel* channel;
	ENetProtocol command;

	if (channelCount < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
		channelCount = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;
	else if (channelCount > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
		channelCount = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;

	for (currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
		if (currentPeer->state == ENET_PEER_STATE_DISCONNECTED)
			break;
	}

	if (currentPeer >= &host->peers[host->peerCount])
		return NULL;

	currentPeer->channels = (ENetChannel*)enet_malloc(channelCount * sizeof(ENetChannel));

	if (currentPeer->channels == NULL)
		return NULL;

	currentPeer->channelCount = channelCount;
	currentPeer->state = ENET_PEER_STATE_CONNECTING;
	currentPeer->address = *address;
	currentPeer->connectID = ++host->randomSeed;

	if (host->outgoingBandwidth == 0)
		currentPeer->windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
	else
		currentPeer->windowSize = (host->outgoingBandwidth / ENET_PEER_WINDOW_SIZE_SCALE) * ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;

	if (currentPeer->windowSize < ENET_PROTOCOL_MINIMUM_WINDOW_SIZE)
		currentPeer->windowSize = ENET_PROTOCOL_MINIMUM_WINDOW_SIZE;
	else if (currentPeer->windowSize > ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE)
		currentPeer->windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;

	for (channel = currentPeer->channels; channel < &currentPeer->channels[channelCount]; ++channel) {
		channel->outgoingReliableSequenceNumber = 0;
		channel->outgoingUnreliableSequenceNumber = 0;
		channel->incomingReliableSequenceNumber = 0;
		channel->incomingUnreliableSequenceNumber = 0;

		enet_list_clear(&channel->incomingReliableCommands);
		enet_list_clear(&channel->incomingUnreliableCommands);

		channel->usedReliableWindows = 0;

		memset(channel->reliableWindows, 0, sizeof(channel->reliableWindows));
	}

	command.header.command = ENET_PROTOCOL_COMMAND_CONNECT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
	command.header.channelID = 0xFF;
	command.connect.outgoingPeerID = ENET_HOST_TO_NET_16(currentPeer->incomingPeerID);
	command.connect.incomingSessionID = currentPeer->incomingSessionID;
	command.connect.outgoingSessionID = currentPeer->outgoingSessionID;
	command.connect.mtu = ENET_HOST_TO_NET_32(currentPeer->mtu);
	command.connect.windowSize = ENET_HOST_TO_NET_32(currentPeer->windowSize);
	command.connect.channelCount = ENET_HOST_TO_NET_32(channelCount);
	command.connect.incomingBandwidth = ENET_HOST_TO_NET_32(host->incomingBandwidth);
	command.connect.outgoingBandwidth = ENET_HOST_TO_NET_32(host->outgoingBandwidth);
	command.connect.packetThrottleInterval = ENET_HOST_TO_NET_32(currentPeer->packetThrottleInterval);
	command.connect.packetThrottleAcceleration = ENET_HOST_TO_NET_32(currentPeer->packetThrottleAcceleration);
	command.connect.packetThrottleDeceleration = ENET_HOST_TO_NET_32(currentPeer->packetThrottleDeceleration);
	command.connect.connectID = currentPeer->connectID;
	command.connect.data = ENET_HOST_TO_NET_32(data);

	enet_peer_queue_outgoing_command(currentPeer, &command, NULL, 0, 0);

	return currentPeer;
}